

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O3

void * la_miam_file_tmp_key_get(void *msg_info)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)
           la_xcalloc(1,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/miam.c"
                      ,99,"la_miam_file_tmp_key_get");
  *puVar1 = *msg_info;
  *(undefined2 *)(puVar1 + 1) = *(undefined2 *)((long)msg_info + 8);
  return puVar1;
}

Assistant:

static void *la_miam_file_tmp_key_get(void const *msg_info) {
	la_assert(msg_info != NULL);
	la_miam_file_key const *msg = msg_info;
	LA_NEW(la_miam_file_key, key);
	key->reg = (char *)msg->reg;
	key->file_id = msg->file_id;
	return (void *)key;
}